

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O3

void __thiscall UnitTest_table2::Run(UnitTest_table2 *this)

{
  pointer pVVar1;
  bool bVar2;
  Value VVar3;
  Table t;
  String value_str;
  String key_str;
  string local_108;
  anon_union_8_9_8deb4486_for_Value_0 local_e8;
  ValueT local_e0;
  anon_union_8_9_8deb4486_for_Value_0 local_d8;
  undefined4 local_d0;
  Table local_c8;
  anon_union_8_9_8deb4486_for_Value_0 local_a0;
  undefined4 local_98;
  String local_90;
  String local_58;
  
  luna::Table::Table(&local_c8);
  luna::String::String((&local_58.super_GCObject).str_,"key");
  luna::String::String((&local_90.super_GCObject).str_,"value");
  local_d0 = 3;
  local_e0 = 3;
  local_e8.obj_ = (&local_90.super_GCObject).obj_;
  local_d8.obj_ = (&local_58.super_GCObject).obj_;
  luna::Table::SetValue(&local_c8,(Value *)&local_d8,(Value *)&local_e8);
  VVar3 = luna::Table::GetValue(&local_c8,(Value *)&local_d8);
  local_e8 = VVar3.field_0;
  local_e0 = VVar3.type_;
  if (local_e0 != ValueT_Obj) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"\'value.type_ == luna::ValueT_Obj\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  if (local_e8.obj_ != (&local_90.super_GCObject).obj_) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"\'value.obj_ == &value_str\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  local_98 = 3;
  local_a0.obj_ = (&local_90.super_GCObject).obj_;
  VVar3 = luna::Table::GetValue(&local_c8,(Value *)&local_a0);
  local_e8 = VVar3.field_0;
  local_e0 = VVar3.type_;
  if (local_e0 != ValueT_Nil) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"\'value.type_ == luna::ValueT_Nil\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  bVar2 = luna::Table::FirstKeyValue(&local_c8,(Value *)&local_d8,(Value *)&local_e8);
  if (!bVar2) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"\'t.FirstKeyValue(key, value)\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  if (local_d8.obj_ != (&local_58.super_GCObject).obj_) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"\'key.obj_ == &key_str\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  if (local_e8.obj_ != (&local_90.super_GCObject).obj_) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"\'value.obj_ == &value_str\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  bVar2 = luna::Table::NextKeyValue
                    (&local_c8,(Value *)&local_d8,(Value *)&local_d8,(Value *)&local_e8);
  if (bVar2) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"\'!t.NextKeyValue(key, key, value)\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  luna::String::~String(&local_90);
  luna::String::~String(&local_58);
  local_c8.super_GCObject._vptr_GCObject = (_func_int **)&PTR__Table_00188608;
  if ((__uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
       )local_c8.hash_._M_t.
        super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
        .
        super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
       )0x0) {
    std::
    _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_c8.hash_._M_t.
                     super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                     .
                     super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
                     ._M_head_impl);
    operator_delete((void *)local_c8.hash_._M_t.
                            super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                            .
                            super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
                            ._M_head_impl);
  }
  local_c8.hash_._M_t.
  super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
          )0x0;
  if ((tuple<std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
       )local_c8.array_._M_t.
        super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
        .super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>.
        _M_head_impl !=
      (_Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>)0x0) {
    pVVar1 = (((_Vector_base<luna::Value,_std::allocator<luna::Value>_> *)
              local_c8.array_._M_t.
              super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
              .
              super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
              ._M_head_impl)->_M_impl).super__Vector_impl_data._M_start;
    if (pVVar1 != (pointer)0x0) {
      operator_delete(pVVar1);
    }
    operator_delete((void *)local_c8.array_._M_t.
                            super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                            .
                            super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
                            ._M_head_impl);
  }
  local_c8.array_._M_t.
  super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
  .super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                    )0x0;
  luna::GCObject::~GCObject(&local_c8.super_GCObject);
  return;
}

Assistant:

TEST_CASE(table2)
{
    luna::Table t;
    luna::String key_str("key");
    luna::String value_str("value");

    luna::Value key;
    luna::Value value;

    key.type_ = luna::ValueT_Obj;
    key.obj_ = &key_str;
    value.type_ = luna::ValueT_Obj;
    value.obj_ = &value_str;

    t.SetValue(key, value);
    value = t.GetValue(key);

    EXPECT_TRUE(value.type_ == luna::ValueT_Obj);
    EXPECT_TRUE(value.obj_ == &value_str);

    luna::Value key_not_existed;
    key_not_existed.type_ = luna::ValueT_Obj;
    key_not_existed.obj_ = &value_str;

    value = t.GetValue(key_not_existed);
    EXPECT_TRUE(value.type_ == luna::ValueT_Nil);

    EXPECT_TRUE(t.FirstKeyValue(key, value));
    EXPECT_TRUE(key.obj_ == &key_str);
    EXPECT_TRUE(value.obj_ == &value_str);

    EXPECT_TRUE(!t.NextKeyValue(key, key, value));
}